

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_x509.cc
# Opt level: O1

X509 * X509_dup(X509 *x509)

{
  uint uVar1;
  X509 *pXVar2;
  uint8_t *der;
  uint8_t *inp;
  uint8_t *local_18;
  uint8_t *local_10;
  
  local_18 = (uint8_t *)0x0;
  uVar1 = i2d_X509((X509 *)x509,&local_18);
  if ((int)uVar1 < 0) {
    pXVar2 = (X509 *)0x0;
  }
  else {
    local_10 = local_18;
    pXVar2 = d2i_X509((X509 **)0x0,&local_10,(ulong)uVar1);
    OPENSSL_free(local_18);
  }
  return pXVar2;
}

Assistant:

X509 *X509_dup(X509 *x509) {
  uint8_t *der = NULL;
  int len = i2d_X509(x509, &der);
  if (len < 0) {
    return NULL;
  }

  const uint8_t *inp = der;
  X509 *ret = d2i_X509(NULL, &inp, len);
  OPENSSL_free(der);
  return ret;
}